

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_buffered_data.cpp
# Opt level: O1

void __thiscall duckdb::SimpleBufferedData::Append(SimpleBufferedData *this,DataChunk *to_append)

{
  iterator *piVar1;
  _Elt_pointer puVar2;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> _Var3;
  DataChunk *this_00;
  pointer pDVar4;
  Allocator *allocator;
  type other;
  idx_t iVar5;
  templated_unique_single_t chunk;
  unique_lock<std::mutex> lock;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_40;
  undefined1 local_38 [24];
  
  this_00 = (DataChunk *)operator_new(0x40);
  DataChunk::DataChunk(this_00);
  local_40._M_head_impl = this_00;
  pDVar4 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *
                      )&local_40);
  allocator = Allocator::DefaultAllocator();
  DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)local_38,to_append);
  DataChunk::Initialize(pDVar4,allocator,(vector<duckdb::LogicalType,_true> *)local_38,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_38);
  other = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                    ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                     &local_40);
  DataChunk::Copy(to_append,other,0);
  pDVar4 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *
                      )&local_40);
  iVar5 = DataChunk::GetAllocationSize(pDVar4);
  local_38._0_8_ = &(this->super_BufferedData).glock;
  local_38[8] = false;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_38);
  local_38[8] = true;
  LOCK();
  (this->buffered_count).super___atomic_base<unsigned_long>._M_i =
       (this->buffered_count).super___atomic_base<unsigned_long>._M_i + iVar5;
  UNLOCK();
  puVar2 = (this->buffered_chunks).c.
           super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar2 == (this->buffered_chunks).c.
                super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    ::std::
    deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
    ::
    _M_push_back_aux<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
              ((deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
                *)&this->buffered_chunks,
               (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
               &local_40);
  }
  else {
    (puVar2->super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)._M_t.
    super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
    super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl = local_40._M_head_impl;
    local_40._M_head_impl = (DataChunk *)0x0;
    piVar1 = &(this->buffered_chunks).c.
              super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  _Var3._M_head_impl = local_40._M_head_impl;
  if (local_40._M_head_impl != (DataChunk *)0x0) {
    DataChunk::~DataChunk(local_40._M_head_impl);
    operator_delete(_Var3._M_head_impl);
  }
  return;
}

Assistant:

void SimpleBufferedData::Append(const DataChunk &to_append) {
	auto chunk = make_uniq<DataChunk>();
	chunk->Initialize(Allocator::DefaultAllocator(), to_append.GetTypes());
	to_append.Copy(*chunk, 0);
	auto allocation_size = chunk->GetAllocationSize();

	unique_lock<mutex> lock(glock);
	buffered_count += allocation_size;
	buffered_chunks.push(std::move(chunk));
}